

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

InternalParseResult * __thiscall
Catch::Clara::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  ParserBase *pPVar3;
  bool bVar4;
  pointer pPVar5;
  pointer pPVar6;
  pointer pPVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Arg *arg;
  pointer pOVar9;
  pointer pOVar10;
  Opt *opt;
  size_type in_R9;
  _Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *this_00;
  StringRef lhs;
  StringRef rhs;
  vector<ParserInfo,_std::allocator<ParserInfo>_> parseInfos;
  value_type local_168;
  ParseResultType local_158;
  StringRef *local_150;
  StringRef *pSStack_148;
  pointer local_140;
  pointer pTStack_138;
  pointer local_130;
  char *local_128;
  size_type local_120;
  char local_118;
  undefined7 uStack_117;
  undefined8 uStack_110;
  vector<ParserInfo,_std::allocator<ParserInfo>_> local_108;
  StringRef *local_e8;
  StringRef *pSStack_e0;
  pointer local_d8;
  pointer pTStack_d0;
  pointer local_c8;
  string local_c0;
  StringRef *pSStack_a0;
  pointer local_98;
  pointer pTStack_90;
  pointer local_88;
  long *local_80 [2];
  long local_70 [2];
  ParserResult local_60;
  
  local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar10 = (this->m_options).
            super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar9 = (this->m_options).
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = (_Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *)
            (((long)(this->m_args).
                    super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_args).
                    super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 6) +
            ((long)pOVar9 - (long)pOVar10 >> 3) * 0x2e8ba2e8ba2e8ba3);
  if ((ulong)this_00 >> 0x3b != 0) {
    std::__throw_length_error("vector::reserve");
  }
  if (this_00 != (_Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *)0x0) {
    local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         std::_Vector_base<ParserInfo,_std::allocator<ParserInfo>_>::_M_allocate
                   (this_00,(size_t)this);
    pOVar10 = (this->m_options).
              super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
              super__Vector_impl_data._M_start;
    pOVar9 = (this->m_options).
             super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
         super__Vector_impl_data._M_finish + (long)this_00;
  }
  local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pOVar10 != pOVar9) {
    do {
      local_168.count = 0;
      local_168.parser = (ParserBase *)pOVar10;
      std::vector<ParserInfo,_std::allocator<ParserInfo>_>::push_back(&local_108,&local_168);
      pOVar10 = pOVar10 + 1;
    } while (pOVar10 != pOVar9);
  }
  pOVar10 = (pointer)(this->m_args).
                     super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  pOVar9 = (pointer)(this->m_args).
                    super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar10 != pOVar9) {
    do {
      local_168.count = 0;
      local_168.parser = (ParserBase *)pOVar10;
      std::vector<ParserInfo,_std::allocator<ParserInfo>_>::push_back(&local_108,&local_168);
      pOVar10 = (pointer)&pOVar10->m_optNames;
    } while (pOVar10 != pOVar9);
  }
  ExeName::set(&local_60,&this->m_exeName,exeName);
  local_60.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001b1540;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_errorMessage._M_dataplus._M_p != &local_60.m_errorMessage.field_2) {
    operator_delete(local_60.m_errorMessage._M_dataplus._M_p,
                    local_60.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  pPVar7 = local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar6 = local_108.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_60.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__ResultValueBase_001b1598;
  local_130 = (tokens->m_tokenBuffer).
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_140 = (tokens->m_tokenBuffer).
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pTStack_138 = (tokens->m_tokenBuffer).
                super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.count = local_168.count & 0xffffffff00000000;
  local_158 = NoMatch;
  local_150 = (tokens->it)._M_current;
  pSStack_148 = (tokens->itEnd)._M_current;
  local_168.parser = (ParserBase *)&PTR__BasicResult_001b1450;
  local_128 = &local_118;
  local_120 = 0;
  local_118 = '\0';
  do {
    (*(code *)local_168.parser[2]._vptr_ParserBase)(&local_168);
    pPVar5 = pPVar6;
    if ((local_140 == pTStack_138) && (local_150 == pSStack_148)) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase.m_type = (ResultType)local_168.count;
      if ((ResultType)local_168.count == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_type = local_158;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current = local_150;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current = pSStack_148;
        *(pointer *)
         ((long)&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
                 field_0 + 0x18) = local_140;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTStack_138;
LAB_00144dfd:
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_130;
        local_140 = (pointer)0x0;
        pTStack_138 = (pointer)0x0;
        local_130 = (pointer)0x0;
      }
LAB_00144e16:
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1450;
      paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_128 == &local_118) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_117,local_118);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_110;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_128;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             CONCAT71(uStack_117,local_118);
      }
LAB_00144d37:
      local_128 = &local_118;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = local_120;
      local_120 = 0;
      local_118 = '\0';
      goto LAB_00144d53;
    }
    for (; pPVar5 != pPVar7; pPVar5 = pPVar5 + 1) {
      iVar8 = (*pPVar5->parser->_vptr_ParserBase[4])();
      if ((CONCAT44(extraout_var,iVar8) == 0) ||
         (uVar2 = pPVar5->count, iVar8 = (*pPVar5->parser->_vptr_ParserBase[4])(),
         uVar2 < CONCAT44(extraout_var_00,iVar8))) {
        pPVar3 = pPVar5->parser;
        (*(code *)local_168.parser[2]._vptr_ParserBase)(&local_168);
        local_e8 = local_150;
        pSStack_e0 = pSStack_148;
        local_d8 = local_140;
        pTStack_d0 = pTStack_138;
        local_c8 = local_130;
        local_140 = (pointer)0x0;
        pTStack_138 = (pointer)0x0;
        local_130 = (pointer)0x0;
        (*pPVar3->_vptr_ParserBase[3])(&local_c0,pPVar3,exeName,&local_e8);
        if (((ResultType)local_168.count == 0) && (local_140 != (pointer)0x0)) {
          operator_delete(local_140,(long)local_130 - (long)local_140);
        }
        local_168.count = CONCAT44(local_168.count._4_4_,(int)local_c0._M_string_length);
        if ((int)local_c0._M_string_length == 0) {
          local_158 = local_c0.field_2._M_allocated_capacity._0_4_;
          local_150 = (StringRef *)local_c0.field_2._8_8_;
          pSStack_148 = pSStack_a0;
          local_140 = local_98;
          pTStack_138 = pTStack_90;
          local_130 = local_88;
          local_98 = (pointer)0x0;
          pTStack_90 = (pointer)0x0;
          local_88 = (pointer)0x0;
        }
        std::__cxx11::string::operator=((string *)&local_128,(string *)local_80);
        local_c0._M_dataplus._M_p = (pointer)&PTR__BasicResult_001b1450;
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        local_c0._M_dataplus._M_p = (pointer)&PTR__ResultValueBase_001b14a8;
        if (((int)local_c0._M_string_length == 0) && (local_98 != (pointer)0x0)) {
          operator_delete(local_98,(long)local_88 - (long)local_98);
        }
        if (local_d8 != (pointer)0x0) {
          operator_delete(local_d8,(long)local_c8 - (long)local_d8);
        }
        if ((ResultType)local_168.count != Ok) {
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
          super_ResultBase.m_type = (ResultType)local_168.count;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
          super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1450;
          paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
          if (local_128 == &local_118) {
            paVar1->_M_allocated_capacity = CONCAT71(uStack_117,local_118);
            *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
                 uStack_110;
          }
          else {
            (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_128;
            (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
                 CONCAT71(uStack_117,local_118);
          }
          goto LAB_00144d37;
        }
        (*(code *)local_168.parser[2]._vptr_ParserBase)(&local_168);
        if (local_158 != NoMatch) {
          pPVar5->count = pPVar5->count + 1;
          bVar4 = false;
          goto LAB_00144c54;
        }
      }
    }
    bVar4 = true;
LAB_00144c54:
    (*(code *)local_168.parser[2]._vptr_ParserBase)(&local_168);
    if (local_158 == ShortCircuitAll) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase.m_type = (ResultType)local_168.count;
      if ((ResultType)local_168.count == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_type = ShortCircuitAll;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current = local_150;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current = pSStack_148;
        *(pointer *)
         ((long)&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
                 field_0 + 0x18) = local_140;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTStack_138;
        goto LAB_00144dfd;
      }
      goto LAB_00144e16;
    }
  } while (!bVar4);
  (*(code *)local_168.parser[2]._vptr_ParserBase)();
  lhs.m_size = (size_type)(local_140->token).m_start;
  lhs.m_start = (char *)0x14;
  rhs.m_size = in_R9;
  rhs.m_start = (char *)(local_140->token).m_size;
  operator+[abi_cxx11_(&local_c0,(Catch *)"Unrecognised token: ",lhs,rhs);
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  .m_type = RuntimeError;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1450;
  paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
    paVar1->_M_allocated_capacity =
         CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                  local_c0.field_2._M_allocated_capacity._0_4_);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
         local_c0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_c0._M_dataplus._M_p;
    (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
         CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                  local_c0.field_2._M_allocated_capacity._0_4_);
  }
  (__return_storage_ptr__->m_errorMessage)._M_string_length =
       CONCAT44(local_c0._M_string_length._4_4_,(int)local_c0._M_string_length);
  local_168.parser = (ParserBase *)&PTR__BasicResult_001b1450;
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
LAB_00144d53:
  local_168.parser = (ParserBase *)&PTR__ResultValueBase_001b14a8;
  if (((ResultType)local_168.count == 0) && (local_140 != (pointer)0x0)) {
    operator_delete(local_140,(long)local_130 - (long)local_140);
  }
  if (pPVar6 != (pointer)0x0) {
    operator_delete(pPVar6,(long)local_108.
                                 super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pPVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult
        Parser::parse( std::string const& exeName,
                       Detail::TokenStream tokens ) const {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            std::vector<ParserInfo> parseInfos;
            parseInfos.reserve( m_options.size() + m_args.size() );
            for ( auto const& opt : m_options ) {
                parseInfos.push_back( { &opt, 0 } );
            }
            for ( auto const& arg : m_args ) {
                parseInfos.push_back( { &arg, 0 } );
            }

            m_exeName.set( exeName );

            auto result = Detail::InternalParseResult::ok(
                Detail::ParseState( ParseResultType::NoMatch, CATCH_MOVE(tokens) ) );
            while ( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for ( auto& parseInfo : parseInfos ) {
                    if ( parseInfo.parser->cardinality() == 0 ||
                         parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(
                            exeName, CATCH_MOVE(result).value().remainingTokens() );
                        if ( !result )
                            return result;
                        if ( result.value().type() !=
                             ParseResultType::NoMatch ) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if ( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if ( !tokenParsed )
                    return Detail::InternalParseResult::runtimeError(
                        "Unrecognised token: " +
                        result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }